

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void fall_through(boolean td)

{
  xchar xVar1;
  xchar xVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  char *pcVar7;
  int iVar8;
  int iVar9;
  trap *ptVar10;
  d_level dtmp;
  char msgbuf [256];
  d_level local_13e;
  undefined4 local_13c;
  char local_138 [264];
  
  xVar1 = dunlev(&u.uz);
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002630c2;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002630bd;
  }
  else {
LAB_002630bd:
    if (ublindf != (obj *)0x0) {
LAB_002630c2:
      if (ublindf->oartifact == '\x1d') goto LAB_0026311c;
    }
    if (((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
        ((youmonst.data)->mlet == '\x05')) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) {
      return;
    }
  }
LAB_0026311c:
  iVar9 = (int)xVar1;
  uVar5 = 0;
  do {
    uVar4 = uVar5;
    iVar8 = iVar9;
    uVar5 = mt_random();
    if ((uVar5 & 3) != 0) break;
    iVar9 = iVar8 + 1;
    xVar2 = dunlevs_in_dungeon(&u.uz);
    uVar5 = uVar4 - 1;
  } while (iVar9 < xVar2);
  if (td == '\0') {
    pcVar7 = surface((int)u.ux,(int)u.uy);
    pline("The %s opens up under you!",pcVar7);
  }
  else {
    for (ptVar10 = level->lev_traps; ptVar10 != (trap *)0x0; ptVar10 = ptVar10->ntrap) {
      if ((ptVar10->tx == u.ux) && (ptVar10->ty == u.uy)) goto LAB_00263186;
    }
    ptVar10 = (trap *)0x0;
LAB_00263186:
    if ((ptVar10->field_0x8 & 0x20) == 0) {
      ptVar10->field_0x8 = ptVar10->field_0x8 | 0x20;
      newsym((int)ptVar10->tx,(int)ptVar10->ty);
    }
    if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
      if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
        pcVar7 = "A trap door opens up under you!";
      }
      else {
        pcVar7 = "There\'s a gaping hole under you!";
      }
      pline(pcVar7);
    }
  }
  if ((u.uz.dnum != dungeon_topology.d_sokoban_dnum) ||
     (bVar3 = can_fall_thru(level), bVar3 == '\0')) {
    local_13c = (undefined4)CONCAT71(in_register_00000039,td);
    pcVar7 = "You don\'t fall in.";
    if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
       (((((youmonst.data)->mlet == '\x05' || (u.ustuck != (monst *)0x0)) ||
         (bVar3 = can_fall_thru(level), bVar3 == '\0')) ||
        ((u.uprops[0x3c].extrinsic != 0 || (uVar5 = (youmonst.data)->mflags1, (uVar5 & 1) != 0))))))
    {
LAB_00263268:
      pline(pcVar7);
      impact_drop((obj *)0x0,u.ux,u.uy,'\0');
      if ((char)local_13c != '\0') {
        return;
      }
      (*windowprocs.win_pause)(P_MESSAGE);
      pline("The opening under you closes up.");
      return;
    }
    if (u.usteed == (monst *)0x0) {
      if ((uVar5 & 0x10) != 0) goto LAB_00263268;
    }
    else if ((uVar5 & 0x10) != 0 || ((u.usteed)->data->mflags1 & 1) != 0) goto LAB_00263268;
    bVar3 = In_hell(&u.uz);
    if (((bVar3 != '\0') && ((u.uevent._1_1_ & 2) == 0)) &&
       (xVar2 = dunlevs_in_dungeon(&u.uz), xVar2 + -1 == iVar8)) goto LAB_00263268;
    if (3 < (youmonst.data)->msize) {
      pcVar7 = "You don\'t fit through.";
      goto LAB_00263268;
    }
    bVar3 = next_to_u();
    td = (boolean)local_13c;
    if (bVar3 == '\0') {
      pcVar7 = "You are jerked back by your pet!";
      goto LAB_00263268;
    }
  }
  if (u.ushops[0] != '\0') {
    shopdig(1);
  }
  bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar3 == '\0') {
    local_13e.dnum = u.uz.dnum;
    local_13e.dlevel = (xVar1 + '\x01') - (char)uVar4;
    if (uVar4 < 0xfffffffc) {
      if (uVar4 == 0) goto LAB_0026338c;
      pline("You are falling down an unbelievably deep shaft!");
      pcVar7 = "While falling you wonder how unlikely it is to find such a deep shaft.";
    }
    else {
      pcVar7 = fall_through_falling_down_msgs_rel +
               *(int *)(fall_through_falling_down_msgs_rel + (ulong)~uVar4 * 4);
    }
    pline(pcVar7);
  }
  else {
    find_hell(&local_13e);
  }
LAB_0026338c:
  if (td == '\0') {
    pcVar6 = ceiling((int)u.ux,(int)u.uy);
    pcVar7 = local_138;
    sprintf(pcVar7,"The hole in the %s above you closes up.",pcVar6);
  }
  else {
    pcVar7 = (char *)0x0;
  }
  schedule_goto(&local_13e,'\0','\x01',0,(char *)0x0,pcVar7);
  return;
}

Assistant:

void fall_through(boolean td)	/* td == TRUE : trap door or hole */
{
	d_level dtmp;
	char msgbuf[BUFSZ];
	const char *dont_fall = NULL;
	int currentlevel = dunlev(&u.uz);
	int newlevel = currentlevel;

	/* KMH -- You can't escape the Sokoban level traps */
	if (Blind && Levitation && !In_sokoban(&u.uz)) return;

	do {
	    newlevel++;
	} while (!rn2(4) && newlevel < dunlevs_in_dungeon(&u.uz));

	if (td) {
	    struct trap *t=t_at(level, u.ux,u.uy);
	    seetrap(t);
	    if (!In_sokoban(&u.uz)) {
		if (t->ttyp == TRAPDOOR)
			pline("A trap door opens up under you!");
		else 
			pline("There's a gaping hole under you!");
	    }
	} else pline("The %s opens up under you!", surface(u.ux,u.uy));

	if (In_sokoban(&u.uz) && can_fall_thru(level))
	    ;	/* KMH -- You can't escape the Sokoban level traps */
	else if (Levitation || u.ustuck || !can_fall_thru(level)
	   || Flying || is_clinger(youmonst.data)
	   || (Inhell && !u.uevent.invoked &&
					newlevel == dunlevs_in_dungeon(&u.uz))
		) {
	    dont_fall = "You don't fall in.";
	} else if (youmonst.data->msize >= MZ_HUGE) {
	    dont_fall = "You don't fit through.";
	} else if (!next_to_u()) {
	    dont_fall = "You are jerked back by your pet!";
	}
	if (dont_fall) {
	    pline(dont_fall);
	    /* hero didn't fall through, but any objects here might */
	    impact_drop(NULL, u.ux, u.uy, 0);
	    if (!td) {
		win_pause_output(P_MESSAGE);
		pline("The opening under you closes up.");
	    }
	    return;
	}

	if (*u.ushops) shopdig(1);
	if (Is_stronghold(&u.uz)) {
	    find_hell(&dtmp);
	} else {
	    static const char * const falling_down_msgs[] = {
		"You fall down a shaft!",
		"You fall down a deep shaft!",
		"You keep falling down a really deep shaft!",
		"You keep falling down an unbelievably deep shaft!",
		/* TODO: Hallucination messages */
	    };

	    dtmp.dnum = u.uz.dnum;
	    dtmp.dlevel = newlevel;

	    switch (newlevel - currentlevel) {
	    case 1:
		/* no message when falling to the next level */
		break;
	    case 2:
	    case 3:
	    case 4:
	    case 5:
		pline(falling_down_msgs[newlevel - currentlevel - 2]);
		break;
	    default:
		pline("You are falling down an unbelievably deep shaft!");
		pline("While falling you wonder how unlikely it is "
		      "to find such a deep shaft.");	/* (1/4)^5 ~= 0.1% */
		break;
	    }
	}
	if (!td)
	    sprintf(msgbuf, "The hole in the %s above you closes up.",
		    ceiling(u.ux,u.uy));
	schedule_goto(&dtmp, FALSE, TRUE, 0,
		      NULL, !td ? msgbuf : NULL);
}